

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_socket.c
# Opt level: O3

void forward_message(int type,_Bool padding,socket_message *result)

{
  int iVar1;
  size_t sVar2;
  int *__ptr;
  undefined7 in_register_00000031;
  ulong __size;
  size_t sVar3;
  skynet_message message;
  skynet_message local_40;
  
  __size = 0x18;
  if ((int)CONCAT71(in_register_00000031,padding) != 0) {
    if (result->data == (char *)0x0) {
      result->data = "";
    }
    else {
      sVar2 = strlen(result->data);
      sVar3 = 0x80;
      if (sVar2 < 0x80) {
        sVar3 = sVar2;
      }
      __size = sVar3 + 0x18;
    }
  }
  __ptr = (int *)malloc(__size);
  *__ptr = type;
  __ptr[1] = result->id;
  __ptr[2] = result->ud;
  if (padding) {
    __ptr[4] = 0;
    __ptr[5] = 0;
    memcpy(__ptr + 6,result->data,__size - 0x18);
  }
  else {
    *(char **)(__ptr + 4) = result->data;
  }
  local_40.source = 0;
  local_40.session = 0;
  local_40.sz = __size | 0x600000000000000;
  local_40.data = __ptr;
  iVar1 = skynet_context_push((uint32_t)result->opaque,&local_40);
  if (iVar1 != 0) {
    free(*(void **)(__ptr + 4));
    free(__ptr);
  }
  return;
}

Assistant:

static void
forward_message(int type, bool padding, struct socket_message * result) {
	struct skynet_socket_message *sm;
	size_t sz = sizeof(*sm);
	if (padding) {
		if (result->data) {
			size_t msg_sz = strlen(result->data);
			if (msg_sz > 128) {
				msg_sz = 128;
			}
			sz += msg_sz;
		} else {
			result->data = "";
		}
	}
	sm = (struct skynet_socket_message *)skynet_malloc(sz);
	sm->type = type;
	sm->id = result->id;
	sm->ud = result->ud;
	if (padding) {
		sm->buffer = NULL;
		memcpy(sm+1, result->data, sz - sizeof(*sm));
	} else {
		sm->buffer = result->data;
	}

	struct skynet_message message;
	message.source = 0;
	message.session = 0;
	message.data = sm;
	message.sz = sz | ((size_t)PTYPE_SOCKET << MESSAGE_TYPE_SHIFT);
	
	if (skynet_context_push((uint32_t)result->opaque, &message)) {
		// todo: report somewhere to close socket
		// don't call skynet_socket_close here (It will block mainloop)
		skynet_free(sm->buffer);
		skynet_free(sm);
	}
}